

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vic20.cpp
# Opt level: O3

void __thiscall Commodore::Vic20::Joystick::~Joystick(Joystick *this)

{
  pointer pSVar1;
  pointer pIVar2;
  
  (this->super_ConcreteJoystick).super_Joystick._vptr_Joystick =
       (_func_int **)&PTR__ConcreteJoystick_00591208;
  pSVar1 = (this->super_ConcreteJoystick).stick_types_.
           super__Vector_base<Inputs::ConcreteJoystick::StickType,_std::allocator<Inputs::ConcreteJoystick::StickType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pSVar1 != (pointer)0x0) {
    operator_delete(pSVar1,(long)(this->super_ConcreteJoystick).stick_types_.
                                 super__Vector_base<Inputs::ConcreteJoystick::StickType,_std::allocator<Inputs::ConcreteJoystick::StickType>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar1);
  }
  pIVar2 = (this->super_ConcreteJoystick).inputs_.
           super__Vector_base<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pIVar2 != (pointer)0x0) {
    operator_delete(pIVar2,(long)(this->super_ConcreteJoystick).inputs_.
                                 super__Vector_base<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pIVar2);
  }
  operator_delete(this,0x50);
  return;
}

Assistant:

Joystick(UserPortVIA &user_port_via_port_handler, KeyboardVIA &keyboard_via_port_handler) :
			ConcreteJoystick({
				Input(Input::Up),
				Input(Input::Down),
				Input(Input::Left),
				Input(Input::Right),
				Input(Input::Fire)
			}),
			user_port_via_port_handler_(user_port_via_port_handler),
			keyboard_via_port_handler_(keyboard_via_port_handler) {}